

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_inner.cpp
# Opt level: O1

idx_t duckdb::NestedLoopJoinInner::Perform
                (idx_t *lpos,idx_t *rpos,DataChunk *left_conditions,DataChunk *right_conditions,
                SelectionVector *lvector,SelectionVector *rvector,
                vector<duckdb::JoinCondition,_true> *conditions)

{
  size_type __n;
  idx_t iVar1;
  reference pvVar2;
  reference pvVar3;
  const_reference pvVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  idx_t local_68;
  
  if ((*lpos < left_conditions->count) && (*rpos < right_conditions->count)) {
    pvVar2 = vector<duckdb::Vector,_true>::operator[](&left_conditions->data,0);
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&right_conditions->data,0);
    iVar5 = left_conditions->count;
    iVar1 = right_conditions->count;
    pvVar4 = vector<duckdb::JoinCondition,_true>::operator[](conditions,0);
    local_68 = NestedLoopJoinComparisonSwitch<duckdb::InitialNestedLoopJoin>
                         (pvVar2,pvVar3,iVar5,iVar1,lpos,rpos,lvector,rvector,0,pvVar4->comparison);
    uVar6 = ((long)(conditions->
                   super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                   super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(conditions->
                   super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                   super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    bVar8 = uVar6 < 2;
    if ((local_68 != 0) && (1 < uVar6)) {
      uVar6 = 2;
      do {
        __n = uVar6 - 1;
        pvVar2 = vector<duckdb::Vector,_true>::operator[](&left_conditions->data,__n);
        pvVar3 = vector<duckdb::Vector,_true>::operator[](&right_conditions->data,__n);
        iVar5 = left_conditions->count;
        iVar1 = right_conditions->count;
        pvVar4 = vector<duckdb::JoinCondition,_true>::operator[](conditions,__n);
        local_68 = NestedLoopJoinComparisonSwitch<duckdb::RefineNestedLoopJoin>
                             (pvVar2,pvVar3,iVar5,iVar1,lpos,rpos,lvector,rvector,local_68,
                              pvVar4->comparison);
        uVar7 = ((long)(conditions->
                       super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(conditions->
                       super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        bVar8 = uVar7 <= uVar6;
        if (local_68 == 0) break;
        bVar9 = uVar6 < uVar7;
        uVar6 = uVar6 + 1;
      } while (bVar9);
    }
    iVar5 = 0;
    if (bVar8) {
      iVar5 = local_68;
    }
  }
  else {
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

idx_t NestedLoopJoinInner::Perform(idx_t &lpos, idx_t &rpos, DataChunk &left_conditions, DataChunk &right_conditions,
                                   SelectionVector &lvector, SelectionVector &rvector,
                                   const vector<JoinCondition> &conditions) {
	D_ASSERT(left_conditions.ColumnCount() == right_conditions.ColumnCount());
	if (lpos >= left_conditions.size() || rpos >= right_conditions.size()) {
		return 0;
	}
	// for the first condition, lvector and rvector are not set yet
	// we initialize them using the InitialNestedLoopJoin
	idx_t match_count = NestedLoopJoinComparisonSwitch<InitialNestedLoopJoin>(
	    left_conditions.data[0], right_conditions.data[0], left_conditions.size(), right_conditions.size(), lpos, rpos,
	    lvector, rvector, 0, conditions[0].comparison);
	// now resolve the rest of the conditions
	for (idx_t i = 1; i < conditions.size(); i++) {
		// check if we have run out of tuples to compare
		if (match_count == 0) {
			return 0;
		}
		// if not, get the vectors to compare
		Vector &l = left_conditions.data[i];
		Vector &r = right_conditions.data[i];
		// then we refine the currently obtained results using the RefineNestedLoopJoin
		match_count = NestedLoopJoinComparisonSwitch<RefineNestedLoopJoin>(
		    l, r, left_conditions.size(), right_conditions.size(), lpos, rpos, lvector, rvector, match_count,
		    conditions[i].comparison);
	}
	return match_count;
}